

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall
duckdb::Node::VerifyAllocations
          (Node *this,ART *art,
          unordered_map<unsigned_char,_unsigned_long,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_long>_>_>
          *node_counts)

{
  NodeEntry *pNVar1;
  Node ptr_p;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  idx_t iVar3;
  _Elt_pointer pNVar4;
  _Elt_pointer pNVar5;
  type paVar6;
  iterator iVar7;
  pointer pFVar8;
  data_ptr_t pdVar9;
  InternalException *this_00;
  ulong uVar10;
  idx_t i;
  long lVar11;
  uint uVar12;
  long lVar13;
  Node *pNVar14;
  Prefix prefix;
  ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node> scanner;
  anon_class_16_2_2c945b07 handler;
  string local_d8;
  ART *local_b8;
  _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
  local_b0;
  anon_class_16_2_2c945b07 local_60;
  string local_50;
  
  local_b0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b0._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_b0._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b0._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b0._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b0._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b0._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b0._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b0._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8 = art;
  ::std::
  _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
  ::_M_initialize_map(&local_b0,0);
  local_60.art = art;
  local_60.node_counts = node_counts;
  ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
  Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
            ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&local_b8,&local_60,this);
  if (local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_b0._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b0._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pNVar1 = local_b0._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (pNVar1[0x1f].exhausted == false) {
          pNVar5 = pNVar1 + 0x20;
          pNVar4 = pNVar1 + 0x1f;
          goto LAB_00c0f00b;
        }
        operator_delete(local_b0._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_b0._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_b0._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_b0._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_b0._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
        local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b0._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
        local_b0._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_b0._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else if (local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].exhausted == true) {
        local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      else {
        pNVar4 = local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        pNVar5 = local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur;
LAB_00c0f00b:
        pNVar4->exhausted = true;
        ptr_p.super_IndexPointer.data = (IndexPointer)((pNVar5[-1].node)->super_IndexPointer).data;
        uVar12 = ptr_p.super_IndexPointer.data._4_4_;
        switch(ptr_p.super_IndexPointer.data._7_1_ & 0x7f) {
        case PREFIX:
          Prefix::Prefix((Prefix *)&local_d8,local_b8,ptr_p,true,false);
          ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
          Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
                    ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&local_b8,
                     &local_60,(Node *)local_d8._M_string_length);
          break;
        case LEAF:
        case LEAF_INLINED:
        case NODE_7_LEAF:
        case NODE_15_LEAF:
        case NODE_256_LEAF:
          break;
        case NODE_4:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_b8->allocators);
          _Var2._M_head_impl =
               paVar6->_M_elems[2].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          local_d8._M_dataplus._M_p = (pointer)((ulong)ptr_p.super_IndexPointer.data & 0xffffffff);
          iVar7 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_d8);
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)((long)iVar7.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                          ._M_cur + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar11 = (ulong)(uVar12 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
          iVar3 = (_Var2._M_head_impl)->bitmask_offset;
          if (pdVar9[iVar3 + lVar11] != '\0') {
            uVar10 = 0;
            pNVar14 = (Node *)(pdVar9 + iVar3 + lVar11);
            do {
              pNVar14 = pNVar14 + 1;
              ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
              Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
                        ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&local_b8,
                         &local_60,pNVar14);
              uVar10 = uVar10 + 1;
            } while (uVar10 < (byte)(((Node *)(pdVar9 + iVar3 + lVar11))->super_IndexPointer).data);
          }
          break;
        case NODE_16:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_b8->allocators);
          _Var2._M_head_impl =
               paVar6->_M_elems[3].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          local_d8._M_dataplus._M_p = (pointer)((ulong)ptr_p.super_IndexPointer.data & 0xffffffff);
          iVar7 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_d8);
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)((long)iVar7.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                          ._M_cur + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar11 = (ulong)(uVar12 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
          iVar3 = (_Var2._M_head_impl)->bitmask_offset;
          if (pdVar9[iVar3 + lVar11] != '\0') {
            pNVar14 = (Node *)(pdVar9 + iVar3 + lVar11 + 0x18);
            uVar10 = 0;
            do {
              ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
              Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
                        ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&local_b8,
                         &local_60,pNVar14);
              uVar10 = uVar10 + 1;
              pNVar14 = pNVar14 + 1;
            } while (uVar10 < pdVar9[iVar3 + lVar11]);
          }
          break;
        case NODE_48:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_b8->allocators);
          _Var2._M_head_impl =
               paVar6->_M_elems[4].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          local_d8._M_dataplus._M_p = (pointer)((ulong)ptr_p.super_IndexPointer.data & 0xffffffff);
          iVar7 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_d8);
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)((long)iVar7.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                          ._M_cur + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar13 = (ulong)(uVar12 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
          iVar3 = (_Var2._M_head_impl)->bitmask_offset;
          lVar11 = 0;
          do {
            if ((ulong)pdVar9[lVar11 + iVar3 + lVar13 + 1] != 0x30) {
              ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
              Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
                        ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&local_b8,
                         &local_60,
                         (Node *)(pdVar9 + (ulong)pdVar9[lVar11 + iVar3 + lVar13 + 1] * 8 +
                                           iVar3 + lVar13 + 0x108));
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x100);
          break;
        case NODE_256:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_b8->allocators);
          _Var2._M_head_impl =
               paVar6->_M_elems[5].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          local_d8._M_dataplus._M_p = (pointer)((ulong)ptr_p.super_IndexPointer.data & 0xffffffff);
          iVar7 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_d8);
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)((long)iVar7.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                          ._M_cur + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar11 = (_Var2._M_head_impl)->bitmask_offset +
                   (ulong)(uVar12 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
          lVar13 = 0;
          do {
            if (pdVar9[lVar13 + lVar11 + 0xf] != '\0') {
              ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
              Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
                        ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&local_b8,
                         &local_60,(Node *)(pdVar9 + lVar13 + lVar11 + 8));
            }
            lVar13 = lVar13 + 8;
          } while (lVar13 != 0x800);
          break;
        default:
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,"invalid node type for ART ScanHandleLast: %s","");
          EnumUtil::ToString<duckdb::NType>(&local_50,ptr_p.super_IndexPointer.data._7_1_ & 0x7f);
          InternalException::InternalException<std::__cxx11::string>(this_00,&local_d8,&local_50);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    } while (local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b0._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  ::std::
  _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
  ::~_Deque_base(&local_b0);
  return;
}

Assistant:

void Node::VerifyAllocations(ART &art, unordered_map<uint8_t, idx_t> &node_counts) const {
	D_ASSERT(HasMetadata());
	ARTScanner<ARTScanHandling::EMPLACE, const Node> scanner(art);

	auto handler = [&art, &node_counts](const Node &node) {
		ARTScanHandlingResult result;
		const auto type = node.GetType();
		switch (type) {
		case NType::LEAF_INLINED:
			return ARTScanHandlingResult::SKIP;
		case NType::LEAF: {
			auto &leaf = Ref<Leaf>(art, node, type);
			leaf.DeprecatedVerifyAllocations(art, node_counts);
			return ARTScanHandlingResult::SKIP;
		}
		case NType::NODE_7_LEAF:
		case NType::NODE_15_LEAF:
		case NType::NODE_256_LEAF: {
			result = ARTScanHandlingResult::SKIP;
			break;
		}
		case NType::PREFIX:
		case NType::NODE_4:
		case NType::NODE_16:
		case NType::NODE_48:
		case NType::NODE_256: {
			result = ARTScanHandlingResult::CONTINUE;
			break;
		}
		default:
			throw InternalException("invalid node type for VerifyAllocations: %s", EnumUtil::ToString(type));
		}
		node_counts[GetAllocatorIdx(type)]++;
		return result;
	};

	scanner.Init(handler, *this);
	scanner.Scan(handler);
}